

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_reopen_named_kvs(void)

{
  fdb_status fVar1;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  ulong uVar2;
  char *__format;
  long lVar3;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_kvs_handle *local_7b8;
  fdb_file_handle *local_7b0;
  fdb_kvs_config local_7a8;
  timeval local_790;
  fdb_kvs_info local_780;
  fdb_config local_750;
  char local_658 [256];
  char local_558 [256];
  char local_458 [256];
  fdb_doc *apfStack_358 [101];
  
  gettimeofday(&local_790,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_750.wal_threshold = 0x400;
  local_750.flags = 1;
  local_750.compaction_threshold = '\0';
  fdb_open(&local_7b0,"./compact_test1",&local_750);
  fdb_kvs_open(local_7b0,&local_7b8,"db",&local_7a8);
  fVar1 = fdb_set_log_callback(local_7b8,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x248);
    compact_reopen_named_kvs()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x248,"void compact_reopen_named_kvs()");
  }
  lVar3 = 0;
  for (uVar2 = 0; uVar2 != 100; uVar2 = uVar2 + 1) {
    sprintf(local_558,"key%d",uVar2 & 0xffffffff);
    sprintf(local_658,"meta%d",uVar2 & 0xffffffff);
    sprintf(local_458,"body%d",uVar2 & 0xffffffff);
    keylen = strlen(local_558);
    metalen = strlen(local_658);
    bodylen = strlen(local_458);
    fdb_doc_create((fdb_doc **)((long)apfStack_358 + lVar3),local_558,keylen,local_658,metalen,
                   local_458,bodylen);
    fdb_set(local_7b8,apfStack_358[uVar2]);
    lVar3 = lVar3 + 8;
  }
  fdb_commit(local_7b0,'\0');
  fdb_compact(local_7b0,(char *)0x0);
  fdb_get_kvs_info(local_7b8,&local_780);
  lVar3 = (long)(int)local_780.doc_count;
  fdb_kvs_close(local_7b8);
  fdb_close(local_7b0);
  fdb_open(&local_7b0,"./compact_test1",&local_750);
  fdb_kvs_open(local_7b0,&local_7b8,"db",&local_7a8);
  fdb_get_kvs_info(local_7b8,&local_780);
  if (lVar3 != CONCAT44(local_780.doc_count._4_4_,(int)local_780.doc_count)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x267);
    compact_reopen_named_kvs()::__test_pass = '\x01';
    if (lVar3 != CONCAT44(local_780.doc_count._4_4_,(int)local_780.doc_count)) {
      __assert_fail("(uint64_t)nkvdocs == kvs_info.doc_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x267,"void compact_reopen_named_kvs()");
    }
  }
  fdb_kvs_close(local_7b8);
  fdb_close(local_7b0);
  for (lVar3 = 0; lVar3 != 100; lVar3 = lVar3 + 1) {
    fdb_doc_free(apfStack_358[lVar3]);
  }
  fdb_shutdown();
  memleak_end();
  __format = "%s PASSED\n";
  if (compact_reopen_named_kvs()::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"compact reopen named kvs");
  return;
}

Assistant:

void compact_reopen_named_kvs()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    int nkvdocs;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_kvs_info kvs_info;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_reopen_named_kvs");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // compact
    fdb_compact(dbfile, NULL);

    // save ndocs
    fdb_get_kvs_info(db, &kvs_info);
    nkvdocs = kvs_info.doc_count;

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    // verify kvs stats
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK((uint64_t)nkvdocs == kvs_info.doc_count);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compact reopen named kvs");
}